

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-record.c
# Opt level: O0

void big_record_type_set(BigRecordType *rtype,int i,char *name,char *dtype,int nmemb)

{
  BigRecordField *pBVar1;
  char *pcVar2;
  int nmemb_local;
  char *dtype_local;
  char *name_local;
  int i_local;
  BigRecordType *rtype_local;
  
  if ((ulong)(long)i < rtype->nfield) {
    if (rtype->fields[i].name != (char *)0x0) {
      free(rtype->fields[i].name);
    }
  }
  else {
    pBVar1 = (BigRecordField *)realloc(rtype->fields,(long)(i + 1) << 5);
    rtype->fields = pBVar1;
    memset(rtype->fields + rtype->nfield,0,((long)(i + 1) - rtype->nfield) * 0x20);
    rtype->nfield = (long)(i + 1);
  }
  pcVar2 = _strdup(name);
  rtype->fields[i].name = pcVar2;
  strncpy(rtype->fields[i].dtype,dtype,8);
  rtype->fields[i].nmemb = nmemb;
  return;
}

Assistant:

void
big_record_type_set(BigRecordType * rtype,
    int i,
    const char * name,
    const char * dtype,
    int nmemb)
{
    if(i >= rtype->nfield) {
        rtype->fields = realloc(rtype->fields,
            (i + 1) * sizeof(rtype->fields[0]));
        memset(&rtype->fields[rtype->nfield], 0,
            (i + 1 - rtype->nfield) * sizeof(rtype->fields[0]));
        rtype->nfield = i + 1;
    } else {
        if(rtype->fields[i].name) {
            free(rtype->fields[i].name);
        }
    }
    rtype->fields[i].name = _strdup(name);
    strncpy(rtype->fields[i].dtype, dtype, 8);
    rtype->fields[i].nmemb = nmemb;
}